

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue.h
# Opt level: O2

bool __thiscall
CCheckQueue<FrozenCleanupCheck>::Loop(CCheckQueue<FrozenCleanupCheck> *this,bool fMaster)

{
  CCheckQueue<FrozenCleanupCheck> *pCVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  FrozenCleanupCheck *check;
  pointer pFVar6;
  undefined7 in_register_00000031;
  CCheckQueue<FrozenCleanupCheck> *pCVar7;
  CCheckQueue<FrozenCleanupCheck> CVar8;
  uint uVar9;
  long in_FS_OFFSET;
  uint local_84;
  ulong local_80;
  vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> vChecks;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar7 = this + 0x28;
  if ((int)CONCAT71(in_register_00000031,fMaster) != 0) {
    pCVar7 = this + 0x58;
  }
  vChecks.super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vChecks.super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vChecks.super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<FrozenCleanupCheck,_std::allocator<FrozenCleanupCheck>_>::reserve
            ((vector<FrozenCleanupCheck,_std::allocator<FrozenCleanupCheck>_> *)&vChecks,
             (ulong)*(uint *)(this + 0xb0));
  local_80 = 0;
  CVar8 = (CCheckQueue<FrozenCleanupCheck>)0x1;
  local_84 = (uint)(vector<FrozenCleanupCheck,_std::allocator<FrozenCleanupCheck>_> *)(this + 0x88);
  do {
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              (&lock,(AnnotatedMixin<std::mutex> *)this,"m_mutex",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/checkqueue.h"
               ,0x4b,false);
    if ((int)local_80 == 0) {
      *(int *)(this + 0xa4) = *(int *)(this + 0xa4) + 1;
    }
    else {
      this[0xa8] = (CCheckQueue<FrozenCleanupCheck>)((byte)this[0xa8] & (byte)CVar8);
      pCVar1 = this + 0xac;
      *(int *)pCVar1 = *(int *)pCVar1 - (int)local_80;
      if (*(int *)pCVar1 == 0 && !fMaster) {
        std::condition_variable::notify_one();
      }
    }
    while( true ) {
      lVar3 = *(long *)(this + 0x90);
      if (*(long *)(this + 0x88) != lVar3) break;
      if (((byte)this[0xd0] & 1) != 0) goto LAB_002a6e5a;
      if ((fMaster) && (*(int *)(this + 0xac) == 0)) {
        *(int *)(this + 0xa4) = *(int *)(this + 0xa4) + -1;
        local_84 = (uint)(byte)this[0xa8];
        this[0xa8] = (CCheckQueue<FrozenCleanupCheck>)0x1;
        bVar4 = false;
        goto LAB_002a6ef2;
      }
      *(int *)(this + 0xa0) = *(int *)(this + 0xa0) + 1;
      std::condition_variable::wait((unique_lock *)pCVar7);
      *(int *)(this + 0xa0) = *(int *)(this + 0xa0) + -1;
    }
    if (((byte)this[0xd0] & 1) == 0) {
      uVar5 = (uint)((int)lVar3 - (int)*(long *)(this + 0x88)) /
              (*(int *)(this + 0xa4) + *(int *)(this + 0xa0) + 1U);
      uVar9 = *(uint *)(this + 0xb0);
      if (uVar5 < *(uint *)(this + 0xb0)) {
        uVar9 = uVar5;
      }
      local_80 = (ulong)(uVar9 + (uVar9 == 0));
      std::vector<FrozenCleanupCheck,std::allocator<FrozenCleanupCheck>>::
      _M_assign_aux<std::move_iterator<__gnu_cxx::__normal_iterator<FrozenCleanupCheck*,std::vector<FrozenCleanupCheck,std::allocator<FrozenCleanupCheck>>>>>
                ((vector<FrozenCleanupCheck,std::allocator<FrozenCleanupCheck>> *)&vChecks,
                 (FrozenCleanupCheck *)(lVar3 - local_80),lVar3);
      std::vector<FrozenCleanupCheck,_std::allocator<FrozenCleanupCheck>_>::erase
                ((vector<FrozenCleanupCheck,_std::allocator<FrozenCleanupCheck>_> *)(this + 0x88),
                 (FrozenCleanupCheck *)(lVar3 - local_80),*(FrozenCleanupCheck **)(this + 0x90));
      CVar8 = this[0xa8];
      bVar4 = true;
    }
    else {
LAB_002a6e5a:
      bVar4 = false;
      local_84 = 0;
    }
LAB_002a6ef2:
    std::unique_lock<std::mutex>::~unique_lock(&lock.super_unique_lock);
    pFVar6 = vChecks.
             super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (!bVar4) {
      std::vector<FrozenCleanupCheck,_std::allocator<FrozenCleanupCheck>_>::~vector
                ((vector<FrozenCleanupCheck,_std::allocator<FrozenCleanupCheck>_> *)&vChecks);
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
        __stack_chk_fail();
      }
      return (bool)((byte)local_84 & 1);
    }
    for (; pFVar6 != vChecks.
                     super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
                     ._M_impl.super__Vector_impl_data._M_finish; pFVar6 = pFVar6 + 1) {
      if (((byte)CVar8 & 1) != 0) {
        CVar8 = (CCheckQueue<FrozenCleanupCheck>)0x1;
      }
    }
    std::vector<FrozenCleanupCheck,_std::allocator<FrozenCleanupCheck>_>::clear
              ((vector<FrozenCleanupCheck,_std::allocator<FrozenCleanupCheck>_> *)&vChecks);
  } while( true );
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_mutex)
    {
        std::condition_variable& cond = fMaster ? m_master_cv : m_worker_cv;
        std::vector<T> vChecks;
        vChecks.reserve(nBatchSize);
        unsigned int nNow = 0;
        bool fOk = true;
        do {
            {
                WAIT_LOCK(m_mutex, lock);
                // first do the clean-up of the previous loop run (allowing us to do it in the same critsect)
                if (nNow) {
                    fAllOk &= fOk;
                    nTodo -= nNow;
                    if (nTodo == 0 && !fMaster)
                        // We processed the last element; inform the master it can exit and return the result
                        m_master_cv.notify_one();
                } else {
                    // first iteration
                    nTotal++;
                }
                // logically, the do loop starts here
                while (queue.empty() && !m_request_stop) {
                    if (fMaster && nTodo == 0) {
                        nTotal--;
                        bool fRet = fAllOk;
                        // reset the status for new work later
                        fAllOk = true;
                        // return the current status
                        return fRet;
                    }
                    nIdle++;
                    cond.wait(lock); // wait
                    nIdle--;
                }
                if (m_request_stop) {
                    return false;
                }

                // Decide how many work units to process now.
                // * Do not try to do everything at once, but aim for increasingly smaller batches so
                //   all workers finish approximately simultaneously.
                // * Try to account for idle jobs which will instantly start helping.
                // * Don't do batches smaller than 1 (duh), or larger than nBatchSize.
                nNow = std::max(1U, std::min(nBatchSize, (unsigned int)queue.size() / (nTotal + nIdle + 1)));
                auto start_it = queue.end() - nNow;
                vChecks.assign(std::make_move_iterator(start_it), std::make_move_iterator(queue.end()));
                queue.erase(start_it, queue.end());
                // Check whether we need to do work at all
                fOk = fAllOk;
            }
            // execute work
            for (T& check : vChecks)
                if (fOk)
                    fOk = check();
            vChecks.clear();
        } while (true);
    }